

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMergingCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  bVar1 = SupportsArenas(this->descriptor_);
  if ((!bVar1) &&
     (pOVar2 = FieldDescriptor::containing_oneof(this->descriptor_),
     pOVar2 == (OneofDescriptor *)0x0)) {
    io::Printer::Print(printer,&this->variables_,
                       "$set_hasbit$\n$name$_.AssignWithDefault($default_variable$, from.$name$_);\n"
                      );
    return;
  }
  io::Printer::Print(printer,&this->variables_,"set_$name$(from.$name$());\n");
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  if (SupportsArenas(descriptor_) || descriptor_->containing_oneof() != NULL) {
    // TODO(gpike): improve this
    printer->Print(variables_, "set_$name$(from.$name$());\n");
  } else {
    printer->Print(variables_,
      "$set_hasbit$\n"
      "$name$_.AssignWithDefault($default_variable$, from.$name$_);\n");
  }
}